

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

int __thiscall QDockWidgetLayout::titleHeight(QDockWidgetLayout *this)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  QWidget *pQVar6;
  undefined4 extraout_var;
  ulong uVar8;
  QLayoutItem **ppQVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar10;
  QStyle *pQVar11;
  int iVar12;
  undefined8 uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QFontMetrics titleFontMetrics;
  long *plVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QLayout::parentWidget(&this->super_QLayout);
  pQVar6 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&pQVar6->super_QObject)->
            super_QWidget;
  ppQVar9 = (this->item_list).d.ptr;
  if (ppQVar9[3] != (QLayoutItem *)0x0) {
    iVar4 = (*ppQVar9[3]->_vptr_QLayoutItem[0xd])();
    plVar7 = (long *)CONCAT44(extraout_var,iVar4);
    if (plVar7 != (long *)0x0) {
      cVar1 = (this->super_QLayout).super_QLayoutItem.field_0xc;
      uVar8 = (**(code **)(*plVar7 + 0x70))(plVar7);
      uVar3 = uVar8 >> 0x20;
      if (cVar1 != '\0') {
        uVar3 = uVar8;
      }
      iVar4 = (int)uVar3;
      goto LAB_003d5068;
    }
    ppQVar9 = (this->item_list).d.ptr;
  }
  uVar10 = 0;
  uVar13 = 0;
  iVar4 = 0;
  if (ppQVar9[1] != (QLayoutItem *)0x0) {
    iVar4 = (*ppQVar9[1]->_vptr_QLayoutItem[0xd])();
    uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x70))
                       ((long *)CONCAT44(extraout_var_00,iVar4));
    iVar4 = (int)((ulong)uVar13 >> 0x20);
    ppQVar9 = (this->item_list).d.ptr;
  }
  iVar5 = 0;
  if (ppQVar9[2] != (QLayoutItem *)0x0) {
    iVar5 = (*ppQVar9[2]->_vptr_QLayoutItem[0xd])();
    uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x70))
                       ((long *)CONCAT44(extraout_var_01,iVar5));
    iVar5 = (int)((ulong)uVar10 >> 0x20);
  }
  bVar14 = (this->super_QLayout).super_QLayoutItem.field_0xc != '\0';
  if (bVar14) {
    iVar4 = (int)uVar13;
  }
  iVar12 = (int)uVar10;
  if (!bVar14) {
    iVar12 = iVar5;
  }
  if (iVar12 < iVar4) {
    iVar12 = iVar4;
  }
  _titleFontMetrics = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)&titleFontMetrics);
  pQVar11 = QWidget::style(pQVar6);
  iVar4 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x46,0,pQVar6);
  iVar5 = QFontMetrics::height();
  iVar5 = iVar5 + iVar4 * 2;
  iVar4 = iVar12 + 2;
  if (iVar12 + 2 <= iVar5) {
    iVar4 = iVar5;
  }
  QFontMetrics::~QFontMetrics(&titleFontMetrics);
LAB_003d5068:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QDockWidgetLayout::titleHeight() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return perp(verticalTitleBar, title->sizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (QLayoutItem *item = item_list[CloseButton])
        closeSize = item->widget()->sizeHint();
    if (QLayoutItem *item = item_list[FloatButton])
        floatSize = item->widget()->sizeHint();

    int buttonHeight = qMax(perp(verticalTitleBar, closeSize),
                            perp(verticalTitleBar, floatSize));

    QFontMetrics titleFontMetrics = q->fontMetrics();
    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);

    return qMax(buttonHeight + 2, titleFontMetrics.height() + 2*mw);
}